

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O1

Cut_Cut_t * Cut_CutMergeTwo2(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Cut_Cut_t *pCVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int (*paiVar9) [3];
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int local_38;
  int local_34;
  
  uVar16 = *(uint *)pCut0;
  uVar15 = uVar16 >> 0x1c;
  uVar8 = (ulong)uVar15;
  uVar6 = *(uint *)pCut1;
  uVar4 = uVar6 >> 0x1c;
  if (uVar15 < uVar4) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                  ,0x35,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  uVar1 = p->pParams->nVarsMax;
  if (uVar4 == uVar1 && uVar15 == uVar1) {
    if (0xfffffff < uVar16) {
      uVar7 = 0;
      do {
        if (*(int *)(&pCut0[1].field_0x0 + uVar7 * 4) != *(int *)(&pCut1[1].field_0x0 + uVar7 * 4))
        {
          return (Cut_Cut_t *)0x0;
        }
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
    pCVar5 = Cut_CutAlloc(p);
    if (0xfffffff < uVar16) {
      uVar7 = 0;
      do {
        *(undefined4 *)(&pCVar5[1].field_0x0 + uVar7 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + uVar7 * 4);
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
  }
  else {
    if (uVar15 != uVar1) {
      uVar10 = uVar15;
      if (0xfffffff < uVar6) {
        local_38 = Cut_CutMergeTwo2::M[0][2];
        local_34 = Cut_CutMergeTwo2::M[0][1];
        uVar12 = 0;
        uVar7 = (ulong)(uVar16 >> 0x1c);
        iVar13 = Cut_CutMergeTwo2::M[0][0];
LAB_008d3fd5:
        do {
          uVar14 = uVar7;
          if (0 < (long)uVar14) {
            iVar2 = *(int *)((long)&pCut0->pNext + uVar14 * 4 + 4);
            iVar3 = *(int *)(&pCut1[1].field_0x0 + uVar12 * 4);
            uVar7 = uVar14 - 1;
            if (iVar3 < iVar2) goto LAB_008d3fd5;
            if (iVar2 < iVar3) {
              uVar7 = uVar14 & 0xffffffff;
              if (Cut_CutMergeTwo2::M[uVar7][0] == 0) {
                Cut_CutMergeTwo2::M[uVar7][0] = iVar3;
                Cut_CutMergeTwo2::M[uVar7][1] = 0;
              }
              else if (Cut_CutMergeTwo2::M[uVar7][1] == 0) {
                Cut_CutMergeTwo2::M[uVar7][1] = iVar3;
                Cut_CutMergeTwo2::M[uVar7][2] = 0;
              }
              else {
                if (Cut_CutMergeTwo2::M[uVar7][2] != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                                ,0x69,
                                "Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)"
                               );
                }
                Cut_CutMergeTwo2::M[uVar7][2] = iVar3;
              }
              if ((int)uVar1 <= (int)uVar8) {
                lVar11 = 0;
                do {
                  *(undefined4 *)((long)Cut_CutMergeTwo2::M[0] + lVar11) = 0;
                  lVar11 = lVar11 + 0xc;
                } while ((ulong)(uVar16 >> 0x1c) * 0xc + 0xc != lVar11);
                return (Cut_Cut_t *)0x0;
              }
              uVar8 = (ulong)((int)uVar8 + 1);
            }
          }
          if ((long)uVar14 < 1) {
            if (iVar13 == 0) {
              iVar13 = *(int *)(&pCut1[1].field_0x0 + uVar12 * 4);
              Cut_CutMergeTwo2::M[0][1] = 0;
              local_34 = 0;
              Cut_CutMergeTwo2::M[0][0] = iVar13;
            }
            else if (local_34 == 0) {
              Cut_CutMergeTwo2::M[0][1] = *(int *)(&pCut1[1].field_0x0 + uVar12 * 4);
              Cut_CutMergeTwo2::M[0][2] = 0;
              local_38 = 0;
              local_34 = Cut_CutMergeTwo2::M[0][1];
            }
            else {
              if (local_38 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                              ,0x7d,
                              "Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
              }
              Cut_CutMergeTwo2::M[0][2] = *(int *)(&pCut1[1].field_0x0 + uVar12 * 4);
              local_38 = Cut_CutMergeTwo2::M[0][2];
            }
            if ((int)uVar1 <= (int)uVar8) {
              lVar11 = 0;
              do {
                *(undefined4 *)((long)Cut_CutMergeTwo2::M[0] + lVar11) = 0;
                lVar11 = lVar11 + 0xc;
              } while ((ulong)(uVar16 >> 0x1c) * 0xc + 0xc != lVar11);
              return (Cut_Cut_t *)0x0;
            }
            uVar8 = (ulong)((int)uVar8 + 1);
          }
          uVar10 = (uint)uVar8;
          uVar12 = uVar12 + 1;
          uVar7 = (ulong)(uVar16 >> 0x1c);
        } while (uVar12 != uVar4);
      }
      pCVar5 = Cut_CutAlloc(p);
      uVar8 = 0;
      paiVar9 = Cut_CutMergeTwo2::M;
      uVar16 = 0;
      do {
        if (uVar8 != 0) {
          lVar11 = (long)(int)uVar16;
          uVar16 = uVar16 + 1;
          *(undefined4 *)(&pCVar5[1].field_0x0 + lVar11 * 4) =
               *(undefined4 *)((long)&pCut0->pNext + uVar8 * 4 + 4);
        }
        if ((*paiVar9)[0] != 0) {
          *(int *)(&pCVar5[1].field_0x0 + (long)(int)uVar16 * 4) = (*paiVar9)[0];
          uVar6 = uVar16 + 1;
          if ((*paiVar9)[1] != 0) {
            *(int *)(&pCVar5[1].field_0x0 + (long)(int)(uVar16 + 1) * 4) = (*paiVar9)[1];
            uVar6 = uVar16 + 2;
            if ((*paiVar9)[2] != 0) {
              *(int *)(&pCVar5[1].field_0x0 + (long)(int)(uVar16 + 2) * 4) = (*paiVar9)[2];
              uVar6 = uVar16 + 3;
            }
          }
          uVar16 = uVar6;
          (*paiVar9)[0] = 0;
        }
        uVar8 = uVar8 + 1;
        paiVar9 = paiVar9 + 1;
      } while (uVar15 + 1 != uVar8);
      if (uVar16 != uVar10) {
        __assert_fail("Count == nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                      ,0x9a,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
      }
      uVar16 = uVar10 << 0x1c;
      goto LAB_008d415a;
    }
    if (0xfffffff < uVar6) {
      uVar6 = uVar16 >> 0x1c;
      uVar12 = 0;
      uVar7 = (ulong)uVar6;
LAB_008d3f3d:
      do {
        iVar13 = uVar6 - uVar15;
        if (0 < (long)uVar7) {
          lVar11 = uVar7 * 4;
          uVar7 = uVar7 - 1;
          if (*(int *)((long)&pCut0->pNext + lVar11 + 4) !=
              *(int *)(&pCut1[1].field_0x0 + uVar12 * 4)) goto LAB_008d3f3d;
          iVar13 = 1;
        }
        if (iVar13 == 0) {
          return (Cut_Cut_t *)0x0;
        }
        uVar12 = uVar12 + 1;
        uVar7 = (ulong)uVar6;
      } while (uVar12 != uVar4);
    }
    pCVar5 = Cut_CutAlloc(p);
    if (0xfffffff < uVar16) {
      uVar7 = 0;
      do {
        *(undefined4 *)(&pCVar5[1].field_0x0 + uVar7 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + uVar7 * 4);
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
  }
  uVar16 = uVar16 & 0xf0000000;
LAB_008d415a:
  *(uint *)pCVar5 = *(uint *)pCVar5 & 0xfffffff | uVar16;
  return pCVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Merges two cuts.]

  Description [This procedure works.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cut_Cut_t * Cut_CutMergeTwo2( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    static int M[7][3] = {{0},{0},{0},{0},{0},{0},{0}};
    Cut_Cut_t * pRes;
    int * pRow;
    int nLeaves0, nLeaves1, Limit;
    int i, k, Count, nNodes;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // the case of the largest cut sizes
    Limit = p->pParams->nVarsMax;
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;
    if ( nLeaves0 == Limit && nLeaves1 == Limit )
    {
        for ( i = 0; i < nLeaves0; i++ )
            if ( pCut0->pLeaves[i] != pCut1->pLeaves[i] )
                return NULL;
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = nLeaves0;
        return pRes;
    }
    // the case when one of the cuts is the largest
    if ( nLeaves0 == Limit )
    {
        for ( i = 0; i < nLeaves1; i++ )
        {
            for ( k = nLeaves0 - 1; k >= 0; k-- )
                if ( pCut0->pLeaves[k] == pCut1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return NULL;
        }
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = nLeaves0;
        return pRes;
    }
    // other cases
    nNodes = nLeaves0;
    for ( i = 0; i < nLeaves1; i++ )
    {
        for ( k = nLeaves0 - 1; k >= 0; k-- )
        {
            if ( pCut0->pLeaves[k] > pCut1->pLeaves[i] )
                continue;
            if ( pCut0->pLeaves[k] < pCut1->pLeaves[i] )
            {
                pRow = M[k+1];
                if ( pRow[0] == 0 )
                    pRow[0] = pCut1->pLeaves[i], pRow[1] = 0;
                else if ( pRow[1] == 0 )
                    pRow[1] = pCut1->pLeaves[i], pRow[2] = 0;
                else if ( pRow[2] == 0 )
                    pRow[2] = pCut1->pLeaves[i];
                else 
                    assert( 0 );
                if ( ++nNodes > Limit )
                {
                    for ( i = 0; i <= nLeaves0; i++ )
                        M[i][0] = 0;
                    return NULL;
                }
            }
            break;
        }
        if ( k == -1 )
        {
            pRow = M[0];
            if ( pRow[0] == 0 )
                pRow[0] = pCut1->pLeaves[i], pRow[1] = 0;
            else if ( pRow[1] == 0 )
                pRow[1] = pCut1->pLeaves[i], pRow[2] = 0;
            else if ( pRow[2] == 0 )
                pRow[2] = pCut1->pLeaves[i];
            else 
                assert( 0 );
            if ( ++nNodes > Limit )
            {
                for ( i = 0; i <= nLeaves0; i++ )
                    M[i][0] = 0;
                return NULL;
            }
            continue;
        }
    }

    pRes = Cut_CutAlloc( p );
    for ( Count = 0, i = 0; i <= nLeaves0; i++ )
    {
        if ( i > 0 )
            pRes->pLeaves[Count++] = pCut0->pLeaves[i-1];
        pRow = M[i];
        if ( pRow[0] )
        {
            pRes->pLeaves[Count++] = pRow[0];
            if ( pRow[1] )
            {
                pRes->pLeaves[Count++] = pRow[1];
                if ( pRow[2] )
                    pRes->pLeaves[Count++] = pRow[2];
            }
            pRow[0] = 0;
        }
    }
    assert( Count == nNodes );
    pRes->nLeaves = nNodes;
    return pRes;
}